

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcLaborResource::~IfcLaborResource(IfcLaborResource *this)

{
  undefined1 *this_00;
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  this_00 = &this[-1].super_IfcConstructionResource.field_0x50;
  *(undefined8 *)&this[-1].super_IfcConstructionResource.field_0x50 = 0x812b70;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0x38 = 0x812c60;
  *(undefined8 *)&this[-1].super_IfcConstructionResource.field_0xd8 = 0x812b98;
  this[-1].super_IfcConstructionResource.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcConstructionResource,_4UL>.aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0x812bc0;
  this[-1].super_IfcConstructionResource.ResourceGroup.ptr._M_string_length = 0x812be8;
  *(undefined8 *)((long)&this[-1].super_IfcConstructionResource.ResourceGroup.ptr.field_2 + 8) =
       0x812c10;
  *(undefined8 *)&this->super_IfcConstructionResource = 0x812c38;
  puVar1 = *(undefined1 **)&(this->super_IfcConstructionResource).field_0x10;
  puVar2 = &(this->super_IfcConstructionResource).field_0x20;
  if (puVar1 != puVar2) {
    operator_delete(puVar1,*(long *)puVar2 + 1);
  }
  IfcConstructionResource::~IfcConstructionResource
            ((IfcConstructionResource *)this_00,&PTR_construction_vtable_24__00812c78);
  operator_delete(this_00,0x1c8);
  return;
}

Assistant:

IfcLaborResource() : Object("IfcLaborResource") {}